

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzidentifyrefpattern.cpp
# Opt level: O2

TPZAutoPointer<TPZRefPattern> __thiscall
TPZIdentifyRefPattern::GetUniform(TPZIdentifyRefPattern *this,TPZGeoEl *gel)

{
  uint uVar1;
  TPZRefPattern *this_00;
  ostream *poVar2;
  long *in_RDX;
  string fullfilename;
  string local_40;
  
  uVar1 = (**(code **)(*in_RDX + 0xb8))();
  std::__cxx11::string::string((string *)&local_40,(string *)gel);
  std::__cxx11::string::append((char *)&local_40);
  if (uVar1 < 8) {
    std::__cxx11::string::append((char *)&local_40);
    std::__cxx11::string::append((char *)&local_40);
    this_00 = (TPZRefPattern *)operator_new(0x360);
    TPZRefPattern::TPZRefPattern(this_00,&local_40);
    TPZAutoPointer<TPZRefPattern>::TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)this,this_00);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "TPZIdentifyRefPattern::GetUniform ERROR unknown eltype : ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
    std::endl<char,std::char_traits<char>>(poVar2);
    TPZAutoPointer<TPZRefPattern>::TPZAutoPointer
              ((TPZAutoPointer<TPZRefPattern> *)this,(TPZRefPattern *)0x0);
  }
  std::__cxx11::string::~string((string *)&local_40);
  return (TPZAutoPointer<TPZRefPattern>)(TPZReference *)this;
}

Assistant:

TPZAutoPointer<TPZRefPattern> TPZIdentifyRefPattern::GetUniform(TPZGeoEl * gel){
	MElementType eltype = gel->Type();
	string fullfilename = fPath;
	fullfilename += "/";
	switch (eltype) {
		case (EPoint) : {
			fullfilename += "Point_";
			break;
		}
		case (EOned) : {
			fullfilename += "Linear_";
			break;
		}
		case (ETriangle) : {
			fullfilename += "Triang_";
			break;
		}
		case (EQuadrilateral) : {
			fullfilename += "Quad_";
			break;
		}
		case (ETetraedro) : {
			fullfilename += "Tetra_";
			break;
		}
		case (EPiramide)  : {
			fullfilename += "Piram_";
			break;
		}
		case (EPrisma) : {
			fullfilename += "Prism_";
			break;
		}
		case (ECube) : {
			fullfilename += "Hexa_";
			break;
		}
		default:{
			PZError << "TPZIdentifyRefPattern::GetUniform ERROR unknown eltype : " << eltype << endl;
			return (0);
		}
	}
	fullfilename += "Unif.rpt";
	TPZRefPattern *rp = new TPZRefPattern(fullfilename);
	return rp;
}